

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
EventComparisonNode::EventComparisonNode
          (EventComparisonNode *this,Comparison *comp_to,string *event_to)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_Evaluate_00117c40;
  this->comp = *comp_to;
  std::__cxx11::string::string((string *)&this->event,(string *)event_to);
  return;
}

Assistant:

EventComparisonNode::EventComparisonNode(const Comparison &comp_to, const string &event_to)
    : comp(comp_to)
    , event(event_to)
    {}